

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O2

int NET_RecvRaw(int sock,void *buffer,int length)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  char *buf;
  
  uVar4 = 0xffffffff;
  if (-1 < sock) {
    for (uVar4 = 0; length - uVar4 != 0 && (int)uVar4 <= length; uVar4 = uVar4 + iVar1) {
      while( true ) {
        sVar2 = recv(sock,(void *)((ulong)uVar4 + (long)buffer),(long)(int)(length - uVar4),0);
        iVar1 = (int)sVar2;
        if (iVar1 != -1) break;
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
          return -1;
        }
        *piVar3 = 0;
      }
      if (iVar1 < 0) {
        return iVar1;
      }
      if (iVar1 == 0) {
        return uVar4;
      }
    }
  }
  return uVar4;
}

Assistant:

static int NET_RecvRaw(int sock, void *buffer, int length)
{
  /* Receive exactly length bytes into buffer. Returns number of bytes */
  /* received. Returns -1 in case of error. */


   int nrecv, n;
   char *buf = (char *)buffer;

   if (sock < 0) return -1;
   for (n = 0; n < length; n += nrecv) {
      while ((nrecv = recv(sock, buf+n, length-n, 0)) == -1 && errno == EINTR)
	errno = 0;     /* probably a SIGCLD that was caught */
      if (nrecv < 0)
         return nrecv;
      else if (nrecv == 0)
	break;        /*/ EOF */
   }

   return n;
}